

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::Thermo::getCom(Thermo *this)

{
  SnapshotManager *this_00;
  MoleculeIterator *in_RSI;
  Molecule *in_RDI;
  RealType mass;
  RealType totalMass;
  Vector3d com;
  Molecule *mol;
  MoleculeIterator i;
  Snapshot *snap;
  Snapshot *in_stack_ffffffffffffff38;
  Snapshot *in_stack_ffffffffffffff40;
  Molecule *this_01;
  SimInfo *in_stack_ffffffffffffff60;
  Molecule *this_02;
  double local_60;
  Vector<double,_3U> local_58 [2];
  Molecule *local_28;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_20;
  Snapshot *local_18;
  
  this_01 = in_RDI;
  this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RSI->_M_node);
  local_18 = SnapshotManager::getCurrentSnapshot(this_00);
  if ((local_18->hasCOM & 1U) == 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_20);
    local_60 = 0.0;
    Vector<double,_3U>::Vector(local_58,&local_60);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_ffffffffffffff40,
               (Vector<double,_3U> *)in_stack_ffffffffffffff38);
    this_02 = (Molecule *)0x0;
    local_28 = SimInfo::beginMolecule(in_stack_ffffffffffffff60,in_RSI);
    while (local_28 != (Molecule *)0x0) {
      in_stack_ffffffffffffff40 = (Snapshot *)Molecule::getMass(this_01);
      this_02 = (Molecule *)((double)in_stack_ffffffffffffff40 + (double)this_02);
      Molecule::getCom(this_02);
      OpenMD::operator*((double)in_RDI,(Vector<double,_3U> *)in_stack_ffffffffffffff40);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffff40,
                 (Vector<double,_3U> *)in_stack_ffffffffffffff38);
      local_28 = SimInfo::nextMolecule(in_stack_ffffffffffffff60,in_RSI);
    }
    Vector<double,_3U>::operator/=
              ((Vector<double,_3U> *)in_stack_ffffffffffffff40,(double)in_stack_ffffffffffffff38);
    Snapshot::setCOM(in_stack_ffffffffffffff40,(Vector3d *)in_stack_ffffffffffffff38);
  }
  Snapshot::getCOM(in_stack_ffffffffffffff38);
  return (Vector3d *)this_01;
}

Assistant:

Vector3d Thermo::getCom() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasCOM) {
      SimInfo::MoleculeIterator i;
      Molecule* mol;

      Vector3d com(0.0);
      RealType totalMass(0.0);

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        RealType mass = mol->getMass();
        totalMass += mass;
        com += mass * mol->getCom();
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &totalMass, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, com.getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      com /= totalMass;
      snap->setCOM(com);
    }
    return snap->getCOM();
  }